

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  int trace;
  int count;
  shared_ptr<liblogger::LogFile> *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined1 uVar2;
  char (*in_stack_fffffffffffffe68) [16];
  char (*__args) [13];
  undefined8 in_stack_fffffffffffffe80;
  int iVar4;
  undefined1 *puVar3;
  undefined8 in_stack_fffffffffffffee0;
  undefined1 *puVar5;
  undefined1 local_108 [32];
  char local_e8 [20];
  undefined4 local_d4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [20];
  undefined4 local_8c;
  undefined1 local_78 [32];
  undefined1 local_58 [48];
  undefined1 local_28 [16];
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_4;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  local_4 = 0;
  local_14 = 100000;
  local_18 = 100;
  printf("Rates are in Messages per second\n");
  uVar1 = Benchmark(iVar4);
  printf("           Empty: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkStreamer(iVar4);
  printf("   EmptyStreamer: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkTrace((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                         (int)in_stack_fffffffffffffee0);
  printf("      EmptyTrace: %d\n",(ulong)uVar1);
  printf("\n");
  std::make_shared<liblogger::LogFile,char_const(&)[10]>((char (*) [10])in_stack_fffffffffffffe68);
  puVar5 = local_28;
  std::shared_ptr<liblogger::ILogger>::shared_ptr<liblogger::LogFile,void>
            ((shared_ptr<liblogger::ILogger> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38
            );
  liblogger::LogManager::Add(puVar5);
  std::shared_ptr<liblogger::ILogger>::~shared_ptr((shared_ptr<liblogger::ILogger> *)0x103563);
  std::shared_ptr<liblogger::LogFile>::~shared_ptr((shared_ptr<liblogger::LogFile> *)0x103570);
  uVar1 = Benchmark(iVar4);
  printf("         LogFile: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkStreamer(iVar4);
  printf(" LogFileStreamer: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkTrace((int)((ulong)puVar5 >> 0x20),(int)puVar5);
  printf("    LogFileTrace: %d\n",(ulong)uVar1);
  printf("\n");
  liblogger::LogManager::RemoveAll();
  std::make_shared<liblogger::LogPipe,char_const(&)[16]>(in_stack_fffffffffffffe68);
  std::shared_ptr<liblogger::ILogger>::shared_ptr<liblogger::LogPipe,void>
            ((shared_ptr<liblogger::ILogger> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (shared_ptr<liblogger::LogPipe> *)in_stack_fffffffffffffe38);
  liblogger::LogManager::Add(local_58);
  std::shared_ptr<liblogger::ILogger>::~shared_ptr((shared_ptr<liblogger::ILogger> *)0x10364e);
  std::shared_ptr<liblogger::LogPipe>::~shared_ptr((shared_ptr<liblogger::LogPipe> *)0x10365b);
  uVar1 = Benchmark(iVar4);
  printf("         LogPipe: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkStreamer(iVar4);
  printf(" LogPipeStreamer: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkTrace((int)((ulong)puVar5 >> 0x20),(int)puVar5);
  printf("    LogPipeTrace: %d\n",(ulong)uVar1);
  printf("\n");
  liblogger::LogManager::RemoveAll();
  local_8c = 100;
  std::make_shared<liblogger::LogTail,int>((int *)in_stack_fffffffffffffe68);
  std::shared_ptr<liblogger::ILogger>::shared_ptr<liblogger::LogTail,void>
            ((shared_ptr<liblogger::ILogger> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (shared_ptr<liblogger::LogTail> *)in_stack_fffffffffffffe38);
  liblogger::LogManager::Add(local_78);
  std::shared_ptr<liblogger::ILogger>::~shared_ptr((shared_ptr<liblogger::ILogger> *)0x10372d);
  std::shared_ptr<liblogger::LogTail>::~shared_ptr((shared_ptr<liblogger::LogTail> *)0x10373a);
  uVar1 = Benchmark(iVar4);
  printf("         LogTail: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkStreamer(iVar4);
  printf(" LogTailStreamer: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkTrace((int)((ulong)puVar5 >> 0x20),(int)puVar5);
  printf("    LogTailTrace: %d\n",(ulong)uVar1);
  printf("\n");
  liblogger::LogManager::RemoveAll();
  std::make_shared<liblogger::LogFilterDup>();
  std::shared_ptr<liblogger::ILogFilter>::shared_ptr<liblogger::LogFilterDup,void>
            ((shared_ptr<liblogger::ILogFilter> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (shared_ptr<liblogger::LogFilterDup> *)in_stack_fffffffffffffe38);
  liblogger::LogManager::FilterAdd(local_a0);
  std::shared_ptr<liblogger::ILogFilter>::~shared_ptr((shared_ptr<liblogger::ILogFilter> *)0x1037f9)
  ;
  std::shared_ptr<liblogger::LogFilterDup>::~shared_ptr
            ((shared_ptr<liblogger::LogFilterDup> *)0x103806);
  uVar1 = Benchmark(iVar4);
  printf("        LogFilterDup: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkStreamer(iVar4);
  printf("LogFilterDupStreamer: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkTrace((int)((ulong)puVar5 >> 0x20),(int)puVar5);
  printf("   LogFilterDupTrace: %d\n",(ulong)uVar1);
  printf("\n");
  liblogger::LogManager::FilterRemoveAll();
  local_d4 = 5;
  std::make_shared<liblogger::LogFilterType,liblogger::LogType>
            ((LogType *)in_stack_fffffffffffffe68);
  puVar3 = local_c0;
  std::shared_ptr<liblogger::ILogFilter>::shared_ptr<liblogger::LogFilterType,void>
            ((shared_ptr<liblogger::ILogFilter> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (shared_ptr<liblogger::LogFilterType> *)in_stack_fffffffffffffe38);
  liblogger::LogManager::FilterAdd(puVar3);
  iVar4 = (int)((ulong)puVar3 >> 0x20);
  std::shared_ptr<liblogger::ILogFilter>::~shared_ptr((shared_ptr<liblogger::ILogFilter> *)0x1038d8)
  ;
  std::shared_ptr<liblogger::LogFilterType>::~shared_ptr
            ((shared_ptr<liblogger::LogFilterType> *)0x1038e5);
  uVar1 = Benchmark(iVar4);
  printf("        LogFilterType: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkStreamer(iVar4);
  printf("LogFilterTypeStreamer: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkTrace((int)((ulong)puVar5 >> 0x20),(int)puVar5);
  printf("   LogFilterTypeTrace: %d\n",(ulong)uVar1);
  printf("\n");
  liblogger::LogManager::FilterRemoveAll();
  std::make_shared<liblogger::LogFilterContains,char_const(&)[6]>
            ((char (*) [6])in_stack_fffffffffffffe68);
  __args = (char (*) [13])local_e8;
  std::shared_ptr<liblogger::ILogFilter>::shared_ptr<liblogger::LogFilterContains,void>
            ((shared_ptr<liblogger::ILogFilter> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (shared_ptr<liblogger::LogFilterContains> *)in_stack_fffffffffffffe38);
  liblogger::LogManager::FilterAdd(__args);
  std::shared_ptr<liblogger::ILogFilter>::~shared_ptr((shared_ptr<liblogger::ILogFilter> *)0x1039ab)
  ;
  std::shared_ptr<liblogger::LogFilterContains>::~shared_ptr
            ((shared_ptr<liblogger::LogFilterContains> *)0x1039b8);
  uVar1 = Benchmark(iVar4);
  uVar2 = 0;
  printf("        LogFilterContains: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkStreamer(iVar4);
  printf("LogFilterContainsStreamer: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkTrace((int)((ulong)puVar5 >> 0x20),(int)puVar5);
  printf("   LogFilterContainsTrace: %d\n",(ulong)uVar1);
  printf("\n");
  liblogger::LogManager::FilterRemoveAll();
  std::make_shared<liblogger::LogFilterRegex,char_const(&)[13]>(__args);
  std::shared_ptr<liblogger::ILogFilter>::shared_ptr<liblogger::LogFilterRegex,void>
            ((shared_ptr<liblogger::ILogFilter> *)CONCAT17(uVar2,in_stack_fffffffffffffe40),
             (shared_ptr<liblogger::LogFilterRegex> *)in_stack_fffffffffffffe38);
  liblogger::LogManager::FilterAdd(local_108);
  std::shared_ptr<liblogger::ILogFilter>::~shared_ptr((shared_ptr<liblogger::ILogFilter> *)0x103a7e)
  ;
  std::shared_ptr<liblogger::LogFilterRegex>::~shared_ptr
            ((shared_ptr<liblogger::LogFilterRegex> *)0x103a8b);
  uVar1 = Benchmark(iVar4);
  printf("        LogFilterRegex: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkStreamer(iVar4);
  printf("LogFilterRegexStreamer: %d\n",(ulong)uVar1);
  uVar1 = BenchmarkTrace((int)((ulong)puVar5 >> 0x20),(int)puVar5);
  printf("   LogFilterRegexTrace: %d\n",(ulong)uVar1);
  printf("\n");
  liblogger::LogManager::FilterRemoveAll();
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
    int count = 100000;
    int trace = 100;
	//LogManager::Add();

    printf("Rates are in Messages per second\n");
	printf("           Empty: %d\n", Benchmark(count));
    printf("   EmptyStreamer: %d\n", BenchmarkStreamer(count));
    printf("      EmptyTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");

    LogManager::Add(std::make_shared<LogFile>("/dev/null"));
    printf("         LogFile: %d\n", Benchmark(count));
    printf(" LogFileStreamer: %d\n", BenchmarkStreamer(count));
    printf("    LogFileTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::RemoveAll();

    LogManager::Add(std::make_shared<LogPipe>("cat > /dev/null"));
    printf("         LogPipe: %d\n", Benchmark(count));
    printf(" LogPipeStreamer: %d\n", BenchmarkStreamer(count));
    printf("    LogPipeTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::RemoveAll();

    LogManager::Add(std::make_shared<LogTail>(100));
    printf("         LogTail: %d\n", Benchmark(count));
    printf(" LogTailStreamer: %d\n", BenchmarkStreamer(count));
    printf("    LogTailTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::RemoveAll();

    LogManager::FilterAdd(std::make_shared<LogFilterDup>());
    printf("        LogFilterDup: %d\n", Benchmark(count));
    printf("LogFilterDupStreamer: %d\n", BenchmarkStreamer(count));
    printf("   LogFilterDupTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::FilterRemoveAll();

    LogManager::FilterAdd(std::make_shared<LogFilterType>(LOGGER_CRIT));
    printf("        LogFilterType: %d\n", Benchmark(count));
    printf("LogFilterTypeStreamer: %d\n", BenchmarkStreamer(count));
    printf("   LogFilterTypeTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::FilterRemoveAll();

    LogManager::FilterAdd(std::make_shared<LogFilterContains>("World"));
    printf("        LogFilterContains: %d\n", Benchmark(count));
    printf("LogFilterContainsStreamer: %d\n", BenchmarkStreamer(count));
    printf("   LogFilterContainsTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::FilterRemoveAll();

    LogManager::FilterAdd(std::make_shared<LogFilterRegex>("/somefilter/"));
    printf("        LogFilterRegex: %d\n", Benchmark(count));
    printf("LogFilterRegexStreamer: %d\n", BenchmarkStreamer(count));
    printf("   LogFilterRegexTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::FilterRemoveAll();



	return 0;
}